

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate.cpp
# Opt level: O3

int main(void)

{
  short sVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  char local_41;
  short asStack_40 [4];
  short local_38 [4];
  
  local_38[0] = 4;
  local_38[1] = 6;
  local_38[2] = 9;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nThese are the contents.\n",0x19);
  lVar4 = 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EG.x = \t",8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2a);
  local_41 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_41,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EG.y = \t",8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x35);
  local_41 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_41,1);
  iVar3 = 0;
  do {
    sVar1 = *(short *)((long)asStack_40 + lVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Z[",2);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = \t",5);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
    local_41 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_41,1);
    iVar3 = iVar3 + 1;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
	D EG{ {42, 53}, {4,6,9} };
	std::cout << "\nThese are the contents.\n";

	std::cout<<"EG.x = \t" << EG.x << '\n';
	std::cout<<"EG.y = \t" << EG.y << '\n';

	int ix =0;
	for (short _z : EG.z) {
		std::cout<<"Z[" << ix << "] = \t" << _z << '\n';
		ix++;
	}
	std::cout << std::endl;
}